

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall Text::_drawList(Text *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,(this->_texture).id);
  fVar8 = this->x;
  fVar10 = this->y;
  uVar6 = 0;
  do {
    if ((this->text)._M_string_length <= uVar6) {
      (*glad_glDisable)(0xde1);
      return;
    }
    lVar4 = (this->_font).glyphs_count + 1;
    piVar3 = &(this->_font).glyphs.
              super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl.
              super__Vector_impl_data._M_start[-1].width;
    do {
      piVar5 = piVar3;
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) goto LAB_001247fe;
      piVar3 = piVar5 + 0x14;
    } while (piVar5[0x13] != (int)(this->text)._M_dataplus._M_p[uVar6]);
    fVar11 = (float)piVar5[0x16] + fVar8 + this->kerning;
    iVar1 = piVar5[0x14];
    fVar12 = (float)piVar5[0x17] + fVar10;
    iVar2 = piVar5[0x15];
    (*glad_glBegin)(4);
    (*glad_glColor4f)(1.0,1.0,1.0,1.0);
    (*glad_glTexCoord2f)((GLfloat)piVar5[0x1a],(GLfloat)piVar5[0x1b]);
    (*glad_glVertex3f)(fVar11,fVar12,this->z);
    (*glad_glTexCoord2f)((GLfloat)piVar5[0x1a],(GLfloat)piVar5[0x1d]);
    fVar9 = fVar12 - (float)iVar2;
    (*glad_glVertex3f)(fVar11,fVar9,this->z);
    (*glad_glTexCoord2f)((GLfloat)piVar5[0x1c],(GLfloat)piVar5[0x1d]);
    fVar7 = (float)iVar1 + fVar11;
    (*glad_glVertex3f)(fVar7,fVar9,this->z);
    (*glad_glTexCoord2f)((GLfloat)piVar5[0x1a],(GLfloat)piVar5[0x1b]);
    (*glad_glVertex3f)(fVar11,fVar12,this->z);
    (*glad_glTexCoord2f)((GLfloat)piVar5[0x1c],(GLfloat)piVar5[0x1d]);
    (*glad_glVertex3f)(fVar7,fVar9,this->z);
    (*glad_glTexCoord2f)((GLfloat)piVar5[0x1c],(GLfloat)piVar5[0x1b]);
    (*glad_glVertex3f)(fVar7,fVar12,this->z);
    (*glad_glEnd)();
    fVar8 = fVar8 + (float)piVar5[0x18];
    fVar10 = fVar10 + (float)piVar5[0x19];
LAB_001247fe:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Text::_drawList() {
    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, _texture.id);

    size_t i, j;
    float ix = x, iy = y;
    for(i = 0; i < text.length(); ++i) {
        // Find the glyph
        texture_glyph_t* glyph = 0;
        for(j = 0; j < _font.glyphs_count; ++j) {
            if (_font.glyphs[j].charcode == text[i]) {
                glyph = &_font.glyphs[j];
                break;
            }
        }
        if(!glyph) {
            continue;
        }

        // // Try to dynamically add kerning (NOT WORKING)
        //float k = 0;
        // if (i > 0) {
        //     for (j = 0; j < glyph->kerning_count; ++j) {
        //         //DEBUG_PRINTLN("text[i]: %s text[i-1]: %s", &text[i], &text[i-1]);
        //         if (glyph->kerning[j].codepoint == text[i-1]) {
        //             k = glyph->kerning[j].kerning;
        //             //DEBUG_PRINTLN("text[i]: %d text[i+1]: %d k: %f", &text[i], &text[i-1], k);
        //             break;
        //         }
        //     }
        // }

        // Calculate the size and location based on the current character's glyph
        float ox = ix + glyph->offset_x + kerning;
        float oy = iy + glyph->offset_y;
        float w  = (float)glyph->width;
        float h  = (float)glyph->height;
        
        // Draw the letter
        glBegin(GL_TRIANGLES);
        glColor4f(1.0, 1.0, 1.0, 1.0);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s0, glyph->t1); glVertex3f(ox,     oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t0); glVertex3f(ox + w, oy    , z);
        glEnd();
        
        // Advance to the next letter's position
        ix += glyph->advance_x;
        iy += glyph->advance_y;
    }

    glDisable(GL_TEXTURE_2D);
}